

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

EventLoop * kj::anon_unknown_173::currentEventLoop(void)

{
  long in_FS_OFFSET;
  Fault f;
  DebugComparison<kj::EventLoop_*&,_std::nullptr_t> _kjCondition;
  EventLoop *loop;
  
  loop = *(EventLoop **)(in_FS_OFFSET + -0x28);
  _kjCondition.left = &loop;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = loop != (EventLoop *)0x0;
  if (_kjCondition.result) {
    return loop;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*&,decltype(nullptr)>&,char_const(&)[41]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0xae,FAILED,"loop != nullptr",
             "_kjCondition,\"No event loop is running on this thread.\"",&_kjCondition,
             (char (*) [41])"No event loop is running on this thread.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

EventLoop& currentEventLoop() {
  EventLoop* loop = threadLocalEventLoop;
  KJ_REQUIRE(loop != nullptr, "No event loop is running on this thread.");
  return *loop;
}